

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O1

bool s_to_i32_unsafe(char *s,char *s_end,int32_t *number)

{
  long lVar1;
  char *pcVar2;
  
  if (*s == '-') {
    pcVar2 = s + 1;
    lVar1 = 0;
    while (pcVar2 != s_end) {
      lVar1 = (lVar1 * 10 - (long)*pcVar2) + 0x30;
      pcVar2 = pcVar2 + 1;
      if (lVar1 < -0x80000000) {
        return false;
      }
    }
  }
  else {
    lVar1 = 0;
    for (; s != s_end; s = s + 1) {
      lVar1 = (long)*s + lVar1 * 10 + -0x30;
      if (0x7fffffff < lVar1) {
        return false;
      }
    }
  }
  *number = (int32_t)lVar1;
  return true;
}

Assistant:

bool s_to_i32_unsafe (const char * s, const char * s_end, int32_t & number)
{
	int64_t i = 0;
	if (*s == '-')
	{
		++s;
		for (; s != s_end; ++s)
		{
			i *= 10;
			i -= *s - 0x30;
			if (i < std::numeric_limits<int32_t>::min())
			{
				return false;
			}
		}
	}
	else
	{
		for (; s != s_end; ++s)
		{
			i *= 10;
			i += *s - 0x30;
			if (i > std::numeric_limits<int32_t>::max())
			{
				return false;
			}
		}
	}
	number = static_cast<int32_t> (i);
	return true;
}